

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::bothOrAll_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,size_t count)

{
  bool bVar1;
  char *pcVar2;
  allocator local_19;
  _anonymous_namespace_ *local_18;
  size_t count_local;
  
  bVar1 = false;
  local_18 = this;
  count_local = (size_t)__return_storage_ptr__;
  if (this == (_anonymous_namespace_ *)0x1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    pcVar2 = "all ";
    if (this == (_anonymous_namespace_ *)0x2) {
      pcVar2 = "both ";
    }
    std::allocator<char>::allocator();
    bVar1 = true;
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_19);
  }
  if (bVar1) {
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string bothOrAll( std::size_t count ) {
        return count == 1 ? std::string() :
               count == 2 ? "both " : "all " ;
    }